

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitblt.c
# Opt level: O2

LispPTR N_OP_pilotbitblt(LispPTR pilot_bt_tbl,LispPTR tos)

{
  uint *puVar1;
  DLword *pDVar2;
  DLword *ybase;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  DLword DVar7;
  ushort uVar8;
  ushort uVar9;
  bool bVar10;
  uint uVar11;
  ushort uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  sbyte sVar21;
  ushort uVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint *puVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  uint *puVar35;
  uint uVar36;
  int iVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint *puVar41;
  uint uVar42;
  uint *puVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint local_138;
  uint local_134;
  uint *local_130;
  uint local_118;
  uint local_114;
  uint local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_f4;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  DLword *local_c8;
  uint *local_50;
  sbyte sVar22;
  
  uVar26 = (ulong)pilot_bt_tbl;
  if ((pilot_bt_tbl & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar26);
  }
  uVar3 = Lisp_world[uVar26 + 9];
  uVar4 = Lisp_world[uVar26 + 8];
  if (uVar3 == 0 || uVar4 == 0) {
    return pilot_bt_tbl;
  }
  uVar5 = Lisp_world[uVar26 + 3];
  uVar6 = Lisp_world[uVar26 + 7];
  DVar7 = Lisp_world[uVar26 + 0xb];
  ScreenLocked = 1;
  local_c8 = Lisp_world +
             ((ulong)Lisp_world[uVar26 + 5] |
             (ulong)(uint)(*(int *)(Lisp_world + uVar26 + 4) << 0x10));
  ybase = Lisp_world +
          ((ulong)Lisp_world[uVar26 + 1] | (ulong)(uint)(*(int *)(Lisp_world + uVar26) << 0x10));
  uVar8 = Lisp_world[uVar26 + 6];
  iVar33 = (int)(short)uVar8;
  uVar44 = (uint)(short)Lisp_world[uVar26 + 2];
  uVar9 = Lisp_world[uVar26 + 0xb];
  uVar12 = uVar9 >> 0xb & 1;
  uVar23 = uVar9 >> 9 & 3;
  uVar24 = uVar8 & 0xf;
  uVar38 = (uint)uVar3;
  if ((uVar9 >> 0xc & 1) == 0) {
    local_f4 = (uint)(short)(Lisp_world[uVar26 + 2] | uVar8);
    if ((short)DVar7 < 0) {
      uVar13 = ((uint)uVar3 + (uint)uVar5) - 1;
      uVar26 = (ulong)(uVar13 >> 3) + (long)ybase;
      local_100 = (uVar13 & 7) + ((uint)uVar26 & 3) * 8;
      iVar14 = local_100 - uVar38;
      uVar13 = iVar14 + 1U & 0x1f;
      local_104 = -1 << (~(byte)local_100 & 0x1f);
      local_108 = -(uint)(uVar13 == 0) | ~(-1 << (-(char)uVar13 & 0x1fU));
      local_10c = local_108 & local_104;
      uVar27 = (local_100 ^ 0xffffffff) + uVar38;
      uVar31 = uVar27 >> 5;
      if ((int)uVar27 < 1) {
        uVar31 = 0;
      }
      uVar27 = ((uint)uVar3 + (uint)uVar6) - 1;
      uVar18 = (ulong)(uVar27 >> 3) + (long)local_c8;
      puVar43 = (uint *)(uVar18 & 0xfffffffffffffffc);
      local_e0 = (uVar27 & 7) + ((uint)uVar18 & 3) * 8;
      iVar37 = local_e0 - uVar38;
      uVar27 = iVar37 + 1U & 0x1f;
      local_e4 = iVar14 - iVar37 & 0x1f;
      uVar36 = iVar37 - iVar14 & 0x1f;
      local_dc = ~(-1 << (sbyte)uVar36);
    }
    else {
      uVar26 = (ulong)(uVar5 >> 3) + (long)ybase;
      uVar13 = (uVar5 & 7) + ((uint)uVar26 & 3) * 8;
      local_100 = (uVar3 + uVar13) - 1 & 0x1f;
      local_108 = -1 << (~(byte)local_100 & 0x1f);
      local_104 = -(uint)(uVar13 == 0) | -1 << (-(char)uVar13 & 0x1fU) ^ 0xffffffffU;
      local_10c = local_108 & local_104;
      uVar31 = (uVar13 + uVar3 >> 5) - 1;
      uVar18 = (ulong)(uVar6 >> 3) + (long)local_c8;
      puVar43 = (uint *)(uVar18 & 0xfffffffffffffffc);
      uVar27 = (uVar6 & 7) + ((uint)uVar18 & 3) * 8;
      local_e0 = (uVar3 + uVar27) - 1 & 0x1f;
      local_e4 = uVar13 - uVar27 & 0x1f;
      uVar36 = uVar27 - uVar13 & 0x1f;
      local_dc = -(uint)(uVar36 == 0) | ~(-1 << (sbyte)uVar36);
    }
  }
  else {
    uVar26 = (ulong)(uVar5 >> 3) + (long)ybase;
    uVar13 = (uVar5 & 7) + ((uint)uVar26 & 3) * 8;
    local_100 = (uVar3 + uVar13) - 1 & 0x1f;
    uVar36 = 0;
    local_108 = -1 << (~(byte)local_100 & 0x1f);
    local_104 = -(uint)(uVar13 == 0) | ~(-1 << (-(char)uVar13 & 0x1fU));
    local_10c = local_108 & local_104;
    uVar31 = (uVar13 + uVar38 >> 5) - 1;
    uVar27 = uVar6 & 0xf;
    local_dc = 0;
    local_e0 = 0;
    puVar43 = (uint *)0x0;
    local_e4 = 0;
    local_f4 = uVar44;
  }
  puVar41 = (uint *)(uVar26 & 0xfffffffffffffffc);
  iVar14 = 0x21 - uVar38;
  uVar11 = -(uint)(uVar12 != 0);
  lVar19 = (long)((int)uVar44 >> 5);
  uVar42 = 0;
  puVar30 = puVar43;
  uVar45 = (uint)uVar4;
  uVar17 = uVar8 >> 8 & 0xf;
LAB_0010f06d:
  local_134 = local_104;
  local_118 = local_108;
  local_114 = local_10c;
  uVar47 = local_dc;
  uVar40 = local_e4;
  local_138 = uVar31;
  local_130 = puVar41;
  local_50 = puVar43;
  uVar28 = uVar13;
  uVar29 = uVar27;
  uVar39 = local_100;
  uVar16 = local_e0;
  do {
    if ((int)uVar45 < 1) {
      flush_display_lineregion((ulong)uVar5,ybase,(uint)uVar3,(uint)uVar4);
      ScreenLocked = 0;
      return pilot_bt_tbl;
    }
    uVar34 = ~local_134;
    puVar35 = local_130;
    uVar32 = local_114;
    if ((uVar9 >> 0xc & 1) == 0) {
      sVar21 = (sbyte)uVar36;
      sVar22 = (sbyte)uVar40;
      if ((short)DVar7 < 0) {
        if (uVar16 < uVar39) {
          uVar15 = *puVar30 >> sVar22 & uVar47;
          if (uVar28 + 1 < uVar3 + uVar29) {
            uVar42 = puVar30[-1];
            puVar30 = puVar30 + -2;
            uVar15 = uVar15 | uVar42 << sVar21;
            goto LAB_0010f22b;
          }
          puVar30 = puVar30 + -1;
        }
        else {
          uVar42 = *puVar30;
          puVar30 = puVar30 + -1;
          uVar15 = uVar42 << sVar21;
LAB_0010f22b:
          uVar42 = uVar42 >> sVar22 & uVar47;
        }
        uVar15 = uVar15 ^ uVar11;
        if (iVar14 <= (int)uVar28) {
          uVar32 = *local_130;
          switch(uVar23) {
          case 1:
            uVar15 = uVar15 & uVar32;
            break;
          case 2:
            uVar15 = uVar15 | uVar32;
            break;
          case 3:
            uVar15 = uVar15 ^ uVar32;
          }
          *local_130 = uVar15 & local_134 | uVar32 & uVar34;
          puVar35 = local_130 + -1;
          if (uVar29 == uVar28) {
            if (uVar12 == 0) {
              switch(uVar23) {
              case 0:
                for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                  uVar34 = *puVar30;
                  puVar30 = puVar30 + -1;
                  *puVar35 = uVar34;
                  puVar35 = puVar35 + -1;
                }
                break;
              case 1:
                for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                  uVar34 = *puVar30;
                  puVar30 = puVar30 + -1;
                  *puVar35 = *puVar35 & uVar34;
                  puVar35 = puVar35 + -1;
                }
                break;
              case 2:
                for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                  uVar34 = *puVar30;
                  puVar30 = puVar30 + -1;
                  *puVar35 = *puVar35 | uVar34;
                  puVar35 = puVar35 + -1;
                }
                break;
              case 3:
                for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                  uVar34 = *puVar30;
                  puVar30 = puVar30 + -1;
                  *puVar35 = *puVar35 ^ uVar34;
                  puVar35 = puVar35 + -1;
                }
              }
            }
            else {
              switch(uVar23) {
              case 0:
                for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                  uVar34 = *puVar30;
                  puVar30 = puVar30 + -1;
                  *puVar35 = ~uVar34;
                  puVar35 = puVar35 + -1;
                }
                break;
              case 1:
                for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                  uVar34 = *puVar30;
                  puVar30 = puVar30 + -1;
                  *puVar35 = *puVar35 & ~uVar34;
                  puVar35 = puVar35 + -1;
                }
                break;
              case 2:
                for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                  uVar34 = *puVar30;
                  puVar30 = puVar30 + -1;
                  *puVar35 = *puVar35 | ~uVar34;
                  puVar35 = puVar35 + -1;
                }
                break;
              case 3:
                for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                  uVar34 = *puVar30;
                  puVar30 = puVar30 + -1;
                  *puVar35 = ~(uVar34 ^ *puVar35);
                  puVar35 = puVar35 + -1;
                }
              }
            }
          }
          else if (uVar12 == 0) {
            switch(uVar23) {
            case 0:
              for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                uVar34 = *puVar30;
                puVar30 = puVar30 + -1;
                *puVar35 = uVar34 << sVar21 | uVar42;
                puVar35 = puVar35 + -1;
                uVar42 = uVar34 >> sVar22;
              }
              break;
            case 1:
              for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                uVar34 = *puVar30;
                *puVar35 = *puVar35 & (uVar34 << sVar21 | uVar42);
                puVar30 = puVar30 + -1;
                puVar35 = puVar35 + -1;
                uVar42 = uVar34 >> sVar22;
              }
              break;
            case 2:
              for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                uVar34 = *puVar30;
                puVar30 = puVar30 + -1;
                *puVar35 = uVar34 << sVar21 | *puVar35 | uVar42;
                puVar35 = puVar35 + -1;
                uVar42 = uVar34 >> sVar22;
              }
              break;
            case 3:
              for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                uVar34 = *puVar30;
                *puVar35 = *puVar35 ^ (uVar34 << sVar21 | uVar42);
                puVar30 = puVar30 + -1;
                puVar35 = puVar35 + -1;
                uVar42 = uVar34 >> sVar22;
              }
            }
          }
          else {
            switch(uVar23) {
            case 0:
              for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                uVar34 = *puVar30;
                puVar30 = puVar30 + -1;
                uVar15 = uVar34 << sVar21 | uVar42;
                uVar42 = uVar34 >> sVar22;
                *puVar35 = ~uVar15;
                puVar35 = puVar35 + -1;
              }
              break;
            case 1:
              for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                uVar34 = *puVar30 << sVar21 | uVar42;
                uVar42 = *puVar30 >> sVar22;
                *puVar35 = *puVar35 & ~uVar34;
                puVar30 = puVar30 + -1;
                puVar35 = puVar35 + -1;
              }
              break;
            case 2:
              for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                uVar34 = *puVar30 << sVar21 | uVar42;
                uVar42 = *puVar30 >> sVar22;
                *puVar35 = *puVar35 | ~uVar34;
                puVar30 = puVar30 + -1;
                puVar35 = puVar35 + -1;
              }
              break;
            case 3:
              for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
                uVar34 = *puVar30;
                puVar30 = puVar30 + -1;
                *puVar35 = ~((uVar34 << sVar21 | uVar42) ^ *puVar35);
                puVar35 = puVar35 + -1;
                uVar42 = uVar34 >> sVar22;
              }
            }
          }
          if (uVar28 == 0) goto LAB_0010f7a0;
          uVar15 = uVar42;
          if (uVar28 <= uVar29) {
            uVar15 = *puVar30 << sVar21 | uVar42;
          }
          uVar15 = uVar15 ^ uVar11;
          uVar32 = local_118;
        }
        goto LAB_0010f318;
      }
      uVar46 = *puVar30;
      if ((uVar28 < uVar29) && ((int)(0x20 - uVar38) < (int)uVar29)) {
        puVar1 = puVar30 + 1;
        puVar30 = puVar30 + 2;
        uVar15 = *puVar1 >> sVar22 & uVar47 | uVar46 << sVar21;
        uVar42 = *puVar1 << sVar21 & ~uVar47;
      }
      else {
        puVar30 = puVar30 + 1;
        if (uVar28 < uVar29) {
          uVar15 = uVar46 << sVar21;
        }
        else {
          uVar15 = uVar46 >> sVar22 & uVar47;
          uVar42 = uVar46 << sVar21 & ~uVar47;
        }
      }
      uVar15 = uVar15 ^ uVar11;
      if ((int)uVar28 < iVar14) goto LAB_0010f318;
      uVar32 = *local_130;
      switch(uVar23) {
      case 1:
        uVar15 = uVar15 & uVar32;
        break;
      case 2:
        uVar15 = uVar15 | uVar32;
        break;
      case 3:
        uVar15 = uVar15 ^ uVar32;
      }
      *local_130 = uVar15 & local_134 | uVar32 & uVar34;
      puVar35 = local_130 + 1;
      if (uVar29 == uVar28) {
        if (uVar12 == 0) {
          switch(uVar23) {
          case 0:
            for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
              uVar34 = *puVar30;
              puVar30 = puVar30 + 1;
              *puVar35 = uVar34;
              puVar35 = puVar35 + 1;
            }
            break;
          case 1:
            for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
              uVar34 = *puVar30;
              puVar30 = puVar30 + 1;
              *puVar35 = *puVar35 & uVar34;
              puVar35 = puVar35 + 1;
            }
            break;
          case 2:
            for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
              uVar34 = *puVar30;
              puVar30 = puVar30 + 1;
              *puVar35 = *puVar35 | uVar34;
              puVar35 = puVar35 + 1;
            }
            break;
          case 3:
            for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
              uVar34 = *puVar30;
              puVar30 = puVar30 + 1;
              *puVar35 = *puVar35 ^ uVar34;
              puVar35 = puVar35 + 1;
            }
          }
        }
        else {
          switch(uVar23) {
          case 0:
            for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
              uVar34 = *puVar30;
              puVar30 = puVar30 + 1;
              *puVar35 = ~uVar34;
              puVar35 = puVar35 + 1;
            }
            break;
          case 1:
            for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
              uVar34 = *puVar30;
              puVar30 = puVar30 + 1;
              *puVar35 = *puVar35 & ~uVar34;
              puVar35 = puVar35 + 1;
            }
            break;
          case 2:
            for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
              uVar34 = *puVar30;
              puVar30 = puVar30 + 1;
              *puVar35 = *puVar35 | ~uVar34;
              puVar35 = puVar35 + 1;
            }
            break;
          case 3:
            for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
              uVar34 = *puVar30;
              puVar30 = puVar30 + 1;
              *puVar35 = ~(uVar34 ^ *puVar35);
              puVar35 = puVar35 + 1;
            }
          }
        }
      }
      else if (uVar12 == 0) {
        switch(uVar23) {
        case 0:
          for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
            uVar34 = *puVar30;
            puVar30 = puVar30 + 1;
            *puVar35 = uVar34 >> sVar22 | uVar42;
            puVar35 = puVar35 + 1;
            uVar42 = uVar34 << sVar21;
          }
          break;
        case 1:
          for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
            uVar34 = *puVar30;
            *puVar35 = *puVar35 & (uVar34 >> sVar22 | uVar42);
            puVar30 = puVar30 + 1;
            puVar35 = puVar35 + 1;
            uVar42 = uVar34 << sVar21;
          }
          break;
        case 2:
          for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
            uVar34 = *puVar30;
            puVar30 = puVar30 + 1;
            *puVar35 = uVar34 >> sVar22 | *puVar35 | uVar42;
            puVar35 = puVar35 + 1;
            uVar42 = uVar34 << sVar21;
          }
          break;
        case 3:
          for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
            uVar34 = *puVar30;
            *puVar35 = *puVar35 ^ (uVar34 >> sVar22 | uVar42);
            puVar30 = puVar30 + 1;
            puVar35 = puVar35 + 1;
            uVar42 = uVar34 << sVar21;
          }
        }
      }
      else {
        switch(uVar23) {
        case 0:
          for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
            uVar34 = *puVar30;
            puVar30 = puVar30 + 1;
            uVar15 = uVar34 >> sVar22 | uVar42;
            uVar42 = uVar34 << sVar21;
            *puVar35 = ~uVar15;
            puVar35 = puVar35 + 1;
          }
          break;
        case 1:
          for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
            uVar34 = *puVar30 >> sVar22 | uVar42;
            uVar42 = *puVar30 << sVar21;
            *puVar35 = *puVar35 & ~uVar34;
            puVar30 = puVar30 + 1;
            puVar35 = puVar35 + 1;
          }
          break;
        case 2:
          for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
            uVar34 = *puVar30 >> sVar22 | uVar42;
            uVar42 = *puVar30 << sVar21;
            *puVar35 = *puVar35 | ~uVar34;
            puVar30 = puVar30 + 1;
            puVar35 = puVar35 + 1;
          }
          break;
        case 3:
          for (uVar32 = local_138; 0 < (int)uVar32; uVar32 = uVar32 - 1) {
            uVar34 = *puVar30;
            puVar30 = puVar30 + 1;
            *puVar35 = ~((uVar34 >> sVar22 | uVar42) ^ *puVar35);
            puVar35 = puVar35 + 1;
            uVar42 = uVar34 << sVar21;
          }
        }
      }
      if (uVar39 == 0x1f) goto LAB_0010f7a0;
      uVar15 = uVar42;
      if (uVar16 <= uVar39) {
        uVar15 = *puVar30 >> sVar22 & uVar47 | uVar42;
      }
      uVar15 = uVar15 ^ uVar11;
      uVar34 = *puVar35;
      uVar46 = ~local_118 & uVar34;
      uVar32 = local_118;
      switch(uVar23) {
      case 1:
        goto switchD_0010f334_caseD_1;
      case 2:
        goto switchD_0010f334_caseD_2;
      case 3:
        goto switchD_0010f334_caseD_3;
      }
switchD_0010f334_caseD_0:
      *puVar35 = uVar32 & uVar15 | uVar46;
    }
    else {
      uVar36 = uVar29 - uVar28 & 0xf;
      uVar15 = CONCAT22(*local_c8,*local_c8) << (sbyte)uVar36;
      uVar15 = (uVar15 >> 0x10 | uVar15) ^ (int)(short)-uVar12;
      if ((int)uVar28 < iVar14) {
LAB_0010f318:
        uVar34 = *puVar35;
        uVar46 = ~uVar32 & uVar34;
        switch(uVar23) {
        case 1:
switchD_0010f334_caseD_1:
          uVar15 = uVar15 & uVar34;
          break;
        case 2:
switchD_0010f334_caseD_2:
          uVar15 = uVar15 | uVar34;
          break;
        case 3:
switchD_0010f334_caseD_3:
          uVar15 = uVar15 ^ uVar34;
        }
        goto switchD_0010f334_caseD_0;
      }
      uVar32 = *local_130;
      uVar34 = uVar34 & uVar32;
      switch(uVar23) {
      case 0:
        *local_130 = uVar15 & local_134 | uVar34;
        for (uVar32 = local_138; puVar35 = puVar35 + 1, 0 < (int)uVar32; uVar32 = uVar32 - 1) {
          *puVar35 = uVar15;
        }
        break;
      case 1:
        *local_130 = uVar32 & uVar15 & local_134 | uVar34;
        for (uVar32 = local_138; puVar35 = puVar35 + 1, 0 < (int)uVar32; uVar32 = uVar32 - 1) {
          *puVar35 = *puVar35 & uVar15;
        }
        break;
      case 2:
        *local_130 = (uVar32 | uVar15) & local_134 | uVar34;
        for (uVar32 = local_138; puVar35 = puVar35 + 1, 0 < (int)uVar32; uVar32 = uVar32 - 1) {
          *puVar35 = *puVar35 | uVar15;
        }
        break;
      case 3:
        *local_130 = (uVar32 ^ uVar15) & local_134 | uVar34;
        for (uVar32 = local_138; puVar35 = puVar35 + 1, 0 < (int)uVar32; uVar32 = uVar32 - 1) {
          *puVar35 = *puVar35 ^ uVar15;
        }
      }
      uVar32 = local_118;
      if (uVar39 != 0x1f) goto LAB_0010f318;
    }
LAB_0010f7a0:
    uVar45 = uVar45 - 1;
    if ((uVar9 >> 0xc & 1) != 0) break;
    lVar20 = lVar19;
    uVar26 = (long)(iVar33 >> 5);
    if ((short)DVar7 < 0) {
      if ((local_f4 & 0x1f) != 0) {
        uVar36 = uVar39 + uVar44;
        lVar20 = -(ulong)(0x1f - uVar36 >> 5);
        if (-1 < (int)uVar36) {
          lVar20 = 0;
        }
        uVar39 = uVar36 & 0x1f;
        uVar29 = (uint)uVar3;
        iVar37 = uVar36 - uVar29;
        local_134 = -1 << (~(byte)uVar39 & 0x1f);
        uVar28 = iVar37 + 1U & 0x1f;
        local_118 = -(uint)(uVar28 == 0) | ~(-1 << (-(char)uVar28 & 0x1fU));
        local_114 = local_118 & local_134;
        uVar36 = (uVar39 ^ 0xffffffff) + uVar29;
        local_138 = uVar36 >> 5;
        if ((int)uVar36 < 1) {
          local_138 = 0;
        }
        uVar36 = uVar16 + iVar33;
        uVar26 = (ulong)(uVar36 >> 5);
        if ((int)uVar36 < 0) {
          uVar26 = -(ulong)(0x1f - uVar36 >> 5);
        }
        uVar16 = uVar36 & 0x1f;
        iVar25 = uVar36 - uVar29;
        uVar29 = iVar25 + 1U & 0x1f;
        uVar40 = iVar37 - iVar25 & 0x1f;
        uVar36 = iVar25 - iVar37 & 0x1f;
        uVar47 = ~(-1 << (sbyte)uVar36);
      }
    }
    else if ((local_f4 & 0x1f) != 0) {
      uVar32 = uVar28 + uVar44;
      uVar28 = uVar32 & 0x1f;
      uVar39 = (uVar28 + uVar3) - 1 & 0x1f;
      local_134 = -(uint)(uVar28 == 0) | ~(-1 << (-(char)uVar28 & 0x1fU));
      local_118 = -1 << (~(byte)uVar39 & 0x1f);
      local_114 = local_118 & local_134;
      local_138 = (uVar28 + uVar3 >> 5) - 1;
      uVar34 = uVar29 + iVar33;
      uVar29 = uVar34 & 0x1f;
      uVar16 = uVar3 + 0x1f + uVar34 & 0x1f;
      uVar40 = uVar32 - uVar34 & 0x1f;
      uVar36 = uVar34 - uVar32 & 0x1f;
      uVar47 = -(uint)(uVar36 == 0) | ~(-1 << (sbyte)uVar36);
      lVar20 = (long)((int)uVar32 >> 5);
      uVar26 = (long)((int)uVar34 >> 5);
    }
    local_130 = local_130 + lVar20;
    puVar30 = local_50 + uVar26;
    local_50 = puVar30;
  } while( true );
  lVar20 = lVar19;
  if ((local_f4 & 0x1f) != 0) {
    uVar29 = uVar13 + uVar44;
    uVar13 = uVar29 & 0x1f;
    local_100 = (uVar13 + uVar3) - 1 & 0x1f;
    local_108 = -1 << (~(byte)local_100 & 0x1f);
    local_104 = -(uint)(uVar13 == 0) | ~(-1 << (-(char)uVar13 & 0x1fU));
    local_10c = local_108 & local_104;
    uVar31 = (uVar13 + uVar3 >> 5) - 1;
    lVar20 = (long)((int)uVar29 >> 5);
  }
  puVar41 = puVar41 + lVar20;
  pDVar2 = local_c8 + 1;
  local_c8 = local_c8 + -(ulong)uVar24;
  if ((int)uVar17 < (int)uVar24) {
    local_c8 = pDVar2;
  }
  bVar10 = (int)uVar24 <= (int)uVar17;
  uVar17 = uVar17 + 1;
  if (bVar10) {
    uVar17 = 0;
  }
  goto LAB_0010f06d;
}

Assistant:

LispPTR N_OP_pilotbitblt(LispPTR pilot_bt_tbl, LispPTR tos)
{
  PILOTBBT *pbt;
  DLword *srcbase, *dstbase;
#if defined(SUNDISPLAY) || defined(DOS)
  int displayflg;
#endif
  int sx, dx, w, h, srcbpl, dstbpl, backwardflg;
  int src_comp, op, gray, num_gray, curr_gray_line;

#ifdef INIT

  /* for init, we have to initialize the pointers at the
     first call to pilotbitblt or we die.  If we do it
     earlier we die also.  We set a new flag so we don't
     do it more than once which is a lose also.

     I put this in an ifdef so there won't be any extra
     code when making a regular LDE.  */

  if (!kbd_for_makeinit) {
    init_keyboard(0);
    kbd_for_makeinit = 1;
  }

#endif

  pbt = (PILOTBBT *)NativeAligned4FromLAddr(pilot_bt_tbl);

  w = pbt->pbtwidth;
  h = pbt->pbtheight;
  if ((h <= 0) || (w <= 0)) return (pilot_bt_tbl);
  dx = pbt->pbtdestbit;
  sx = pbt->pbtsourcebit;
  backwardflg = pbt->pbtbackward;
/* if displayflg != 0 then source or destination is DisplayBitMap */
#ifdef DOS
  currentdsp->device.locked++;
#else
  ScreenLocked = T;
#endif /* DOS */

#if defined(SUNDISPLAY) || defined(DOS)
  displayflg = cursorin(pbt->pbtdesthi, (pbt->pbtdestlo + (dx >> 4)), w, h, backwardflg) ||
               cursorin(pbt->pbtsourcehi, (pbt->pbtsourcelo + (sx >> 4)), w, h, backwardflg);
#endif /* SUNDISPLAY */

  srcbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtsourcehi, pbt->pbtsourcelo));
  dstbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtdesthi, pbt->pbtdestlo));

  srcbpl = pbt->pbtsourcebpl;
  dstbpl = pbt->pbtdestbpl;
  src_comp = pbt->pbtsourcetype;
  op = pbt->pbtoperation;
  gray = pbt->pbtusegray;
  num_gray = ((TEXTUREBBT *)pbt)->pbtgrayheightlessone + 1;
  curr_gray_line = ((TEXTUREBBT *)pbt)->pbtgrayoffset;

#ifdef DOS
  if (displayflg) (currentdsp->mouse_invisible)(currentdsp, IOPage);
  ;
#endif /* SUNDISPLAY / DOS */

  new_bitblt_code;

#ifdef DOS
      flush_display_lineregion(dx, dstbase, w, h);
  if (displayflg) (currentdsp->mouse_visible)(IOPage->dlmousex, IOPage->dlmousey);
#endif /* SUNDISPLAY / DOS */

#if defined(XWINDOW) || defined(SDL)
  flush_display_lineregion(dx, dstbase, w, h);
#endif /* XWINDOW */

#ifdef DOS
  currentdsp->device.locked--;
#else
  ScreenLocked = NIL;
#endif /* DOS */

  return (pilot_bt_tbl);

}